

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superblock.cc
# Opt level: O2

void sb_bmp_clear(uint8_t *bmp,bid_t bid,uint64_t len)

{
  _sb_bmp_update(bmp,bid,len,0);
  return;
}

Assistant:

void sb_bmp_clear(uint8_t *bmp, bid_t bid, uint64_t len)
{
    _sb_bmp_update(bmp, bid, len, 0);
}